

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall PClass::InsertIntoHash(PClass *this)

{
  size_t in_RAX;
  PType *oldtype;
  long parm2;
  size_t bucket;
  size_t local_18;
  
  local_18 = in_RAX;
  oldtype = FTypeTable::FindType
                      (&TypeTable,RegistrationInfo.MyClass,
                       (intptr_t)(this->super_PStruct).super_PNamedType.Outer,
                       (long)(this->super_PStruct).super_PNamedType.TypeName.Index,&local_18);
  parm2 = (long)(this->super_PStruct).super_PNamedType.TypeName.Index;
  if (oldtype == (PType *)0x0) {
    FTypeTable::AddType(&TypeTable,(PType *)this,RegistrationInfo.MyClass,
                        (intptr_t)(this->super_PStruct).super_PNamedType.Outer,parm2,local_18);
  }
  else {
    if (strictdecorate.Value == false) {
      Printf("\x1cGTried to register class \'%s\' more than once.\n",
             FName::NameData.NameArray[parm2].Text);
    }
    else {
      I_Error("Tried to register class \'%s\' more than once.\n");
    }
    FTypeTable::ReplaceType(&TypeTable,(PType *)this,oldtype,local_18);
  }
  return;
}

Assistant:

void PClass::InsertIntoHash ()
{
	size_t bucket;
	PType *found;

	found = TypeTable.FindType(RUNTIME_CLASS(PClass), (intptr_t)Outer, TypeName, &bucket);
	if (found != NULL)
	{ // This type has already been inserted
	  // ... but there is no need whatsoever to make it a fatal error!
		if (!strictdecorate) Printf (TEXTCOLOR_RED"Tried to register class '%s' more than once.\n", TypeName.GetChars());
		else I_Error("Tried to register class '%s' more than once.\n", TypeName.GetChars());
		TypeTable.ReplaceType(this, found, bucket);
	}
	else
	{
		TypeTable.AddType(this, RUNTIME_CLASS(PClass), (intptr_t)Outer, TypeName, bucket);
	}
}